

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O3

int Cudd_StdPreReordHook(DdManager *dd,char *str,void *data)

{
  FILE *__stream;
  int iVar1;
  ulong uVar2;
  char *__format;
  
  iVar1 = fprintf((FILE *)dd->out,"%s reordering with ",str);
  if (iVar1 != -1) {
    switch((int)data) {
    case 2:
    case 3:
      __format = "random";
      break;
    case 4:
      __format = "sifting";
      break;
    case 5:
    case 7:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xf:
    case 0x13:
      iVar1 = fprintf((FILE *)dd->out,"converging ");
      if (iVar1 == -1) {
        return 0;
      }
      __format = &DAT_009a2750 +
                 *(int *)(&DAT_009a2750 + (((long)data << 0x20) + -0x500000000 >> 0x1e));
      break;
    case 6:
      __format = "symmetric sifting";
      break;
    case 8:
    case 9:
    case 10:
      __format = "window";
      break;
    case 0xe:
      __format = "group sifting";
      break;
    case 0x10:
      __format = "annealing";
      break;
    case 0x11:
      __format = "genetic";
      break;
    case 0x12:
      __format = "linear sifting";
      break;
    case 0x14:
      __format = "lazy sifting";
      break;
    case 0x15:
      __format = "exact";
      break;
    default:
      goto switchD_007c131a_default;
    }
    iVar1 = fprintf((FILE *)dd->out,__format);
    if (iVar1 != -1) {
      __stream = (FILE *)dd->out;
      iVar1 = strcmp(str,"BDD");
      if (iVar1 == 0) {
        uVar2 = Cudd_ReadNodeCount(dd);
      }
      else {
        uVar2 = (ulong)((dd->keysZ - dd->deadZ) + 2);
      }
      iVar1 = fprintf(__stream,": from %ld to ... ",uVar2);
      if (iVar1 != -1) {
        fflush((FILE *)dd->out);
      }
    }
  }
switchD_007c131a_default:
  return 0;
}

Assistant:

int
Cudd_StdPreReordHook(
  DdManager *dd,
  const char *str,
  void *data)
{
    Cudd_ReorderingType method = (Cudd_ReorderingType) (ptruint) data;
    int retval;

    retval = fprintf(dd->out,"%s reordering with ", str);
    if (retval == EOF) return(0);
    switch (method) {
    case CUDD_REORDER_SIFT_CONVERGE:
    case CUDD_REORDER_SYMM_SIFT_CONV:
    case CUDD_REORDER_GROUP_SIFT_CONV:
    case CUDD_REORDER_WINDOW2_CONV:
    case CUDD_REORDER_WINDOW3_CONV:
    case CUDD_REORDER_WINDOW4_CONV:
    case CUDD_REORDER_LINEAR_CONVERGE:
        retval = fprintf(dd->out,"converging ");
        if (retval == EOF) return(0);
        break;
    default:
        break;
    }
    switch (method) {
    case CUDD_REORDER_RANDOM:
    case CUDD_REORDER_RANDOM_PIVOT:
        retval = fprintf(dd->out,"random");
        break;
    case CUDD_REORDER_SIFT:
    case CUDD_REORDER_SIFT_CONVERGE:
        retval = fprintf(dd->out,"sifting");
        break;
    case CUDD_REORDER_SYMM_SIFT:
    case CUDD_REORDER_SYMM_SIFT_CONV:
        retval = fprintf(dd->out,"symmetric sifting");
        break;
    case CUDD_REORDER_LAZY_SIFT:
        retval = fprintf(dd->out,"lazy sifting");
        break;
    case CUDD_REORDER_GROUP_SIFT:
    case CUDD_REORDER_GROUP_SIFT_CONV:
        retval = fprintf(dd->out,"group sifting");
        break;
    case CUDD_REORDER_WINDOW2:
    case CUDD_REORDER_WINDOW3:
    case CUDD_REORDER_WINDOW4:
    case CUDD_REORDER_WINDOW2_CONV:
    case CUDD_REORDER_WINDOW3_CONV:
    case CUDD_REORDER_WINDOW4_CONV:
        retval = fprintf(dd->out,"window");
        break;
    case CUDD_REORDER_ANNEALING:
        retval = fprintf(dd->out,"annealing");
        break;
    case CUDD_REORDER_GENETIC:
        retval = fprintf(dd->out,"genetic");
        break;
    case CUDD_REORDER_LINEAR:
    case CUDD_REORDER_LINEAR_CONVERGE:
        retval = fprintf(dd->out,"linear sifting");
        break;
    case CUDD_REORDER_EXACT:
        retval = fprintf(dd->out,"exact");
        break;
    default:
        return(0);
    }
    if (retval == EOF) return(0);

    retval = fprintf(dd->out,": from %ld to ... ", strcmp(str, "BDD") == 0 ?
                     Cudd_ReadNodeCount(dd) : Cudd_zddReadNodeCount(dd));
    if (retval == EOF) return(0);
    fflush(dd->out);
    return(1);

}